

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void __thiscall
GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Reset
          (GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *this)

{
  uint local_14;
  uint i;
  GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *this_local;
  
  this->total = 0;
  ChunkedStackPool<65532>::Reset(this->pool);
  for (local_14 = 0; local_14 < (this->largeObjects).count; local_14 = local_14 + 1) {
    (*(code *)NULLC::dealloc)((this->largeObjects).data[local_14]);
  }
  Vector::reset(&this->largeObjects);
  return;
}

Assistant:

void Reset()
	{
		total = 0;

		pool.Reset();

		for(unsigned i = 0; i < largeObjects.count; i++)
			NULLC::dealloc(largeObjects.data[i]);
		largeObjects.reset();
	}